

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall c4::yml::Tree::_clear(Tree *this)

{
  (this->m_arena).len = 0;
  this->m_arena_pos = 0;
  this->m_free_tail = 0;
  (this->m_arena).str = (char *)0x0;
  this->m_size = 0;
  this->m_free_head = 0;
  this->m_buf = (NodeData *)0x0;
  this->m_cap = 0;
  this->m_tag_directives[0].handle.str = (char *)0x0;
  this->m_tag_directives[0].handle.len = 0;
  this->m_tag_directives[0].prefix.str = (char *)0x0;
  this->m_tag_directives[0].prefix.len = 0;
  this->m_tag_directives[0].next_node_id = 0;
  this->m_tag_directives[1].handle.str = (char *)0x0;
  this->m_tag_directives[1].handle.len = 0;
  this->m_tag_directives[1].prefix.str = (char *)0x0;
  this->m_tag_directives[1].prefix.len = 0;
  this->m_tag_directives[1].next_node_id = 0;
  this->m_tag_directives[2].handle.str = (char *)0x0;
  this->m_tag_directives[2].handle.len = 0;
  this->m_tag_directives[2].prefix.str = (char *)0x0;
  this->m_tag_directives[2].prefix.len = 0;
  this->m_tag_directives[2].next_node_id = 0;
  this->m_tag_directives[3].handle.str = (char *)0x0;
  this->m_tag_directives[3].handle.len = 0;
  this->m_tag_directives[3].prefix.str = (char *)0x0;
  this->m_tag_directives[3].prefix.len = 0;
  this->m_tag_directives[3].next_node_id = 0;
  return;
}

Assistant:

void Tree::_clear()
{
    m_buf = nullptr;
    m_cap = 0;
    m_size = 0;
    m_free_head = 0;
    m_free_tail = 0;
    m_arena = {};
    m_arena_pos = 0;
    for(size_t i = 0; i < RYML_MAX_TAG_DIRECTIVES; ++i)
        m_tag_directives[i] = {};
}